

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextElement.h
# Opt level: O2

void __thiscall psy::C::Lexeme::checkHexAndOctalPrefix(Lexeme *this)

{
  byte bVar1;
  ushort uVar2;
  
  if ((*(int *)&this->field_0x8 != 0) && (**(char **)&this->field_0x10 == '0')) {
    uVar2 = 8;
    if (*(int *)&this->field_0x8 != 1) {
      bVar1 = (*(char **)&this->field_0x10)[1];
      uVar2 = 0x10;
      if (((bVar1 | 0x20) != 0x78) && (uVar2 = 8, (bVar1 & 0xf8) != 0x30)) {
        return;
      }
    }
    (this->field_0).BD_ = (this->field_0).BD_ | uVar2;
  }
  return;
}

Assistant:

unsigned int size() const { return size_; }